

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool system_set(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value_00;
  _Bool _Var1;
  gravity_fiber_t *fiber;
  char local_1058 [8];
  char _buffer [4096];
  _Bool result;
  gravity_value_t value;
  gravity_value_t key;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  if (args[1].isa == gravity_class_string) {
    _Var1 = gravity_vm_set(vm,(char *)(args[1].field_1.p)->objclass,args[2]);
    if (_Var1) {
      vm_local._7_1_ = true;
    }
    else {
      snprintf(local_1058,0x1000,"Unable to apply System setting.");
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,local_1058);
      value_00.field_1.n = 0;
      value_00.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_00,rindex);
      vm_local._7_1_ = false;
    }
  }
  else {
    vm_local._7_1_ = true;
  }
  return vm_local._7_1_;
}

Assistant:

static bool system_set (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused (nargs, rindex)
    gravity_value_t key = GET_VALUE(1);
    gravity_value_t value = GET_VALUE(2);
    if (!VALUE_ISA_STRING(key)) RETURN_NOVALUE();

    bool result = gravity_vm_set(vm, VALUE_AS_CSTRING(key), value);
    if (!result) RETURN_ERROR("Unable to apply System setting.");
    RETURN_NOVALUE();
}